

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall Heap<4U>::Insert(Heap<4U> *this,Data<4U> *item,count_type counter)

{
  HashMap<4U> *this_00;
  count_type *pcVar1;
  uint uVar2;
  Counter *pCVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  uint32_t *puVar6;
  uint *puVar7;
  uint32_t i;
  
  this_00 = &this->mp;
  iVar4 = std::
          _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,item);
  if (iVar4.super__Node_iterator_base<std::pair<const_Data<4U>,_int>,_true>._M_cur ==
      (__node_type *)0x0) {
    if (this->heap_num < this->SIZE) {
      *(undefined4 *)this->heaps[this->heap_num].item.str = *(undefined4 *)item->str;
      uVar2 = this->heap_num;
      this->heaps[uVar2].counter = counter;
      this->heap_num = uVar2 + 1;
      puVar7 = (uint *)std::__detail::
                       _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)this_00,item);
      *puVar7 = uVar2;
      Heap_Up(this,this->heap_num - 1);
      return;
    }
    if (counter <= this->heaps->counter) {
      return;
    }
    std::
    _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(&this_00->_M_h);
    *(undefined4 *)(this->heaps->item).str = *(undefined4 *)item->str;
    this->heaps->counter = counter;
    pmVar5 = std::__detail::
             _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,item);
    *pmVar5 = 0;
    i = 0;
  }
  else {
    pCVar3 = this->heaps;
    pmVar5 = std::__detail::
             _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,item);
    pcVar1 = &pCVar3[*pmVar5].counter;
    *pcVar1 = *pcVar1 + 1;
    puVar6 = (uint32_t *)
             std::__detail::
             _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,item);
    i = *puVar6;
  }
  Heap_Down(this,i);
  return;
}

Assistant:

void Insert(const Data<DATA_LEN>& item, count_type counter) {
		if (mp.find(item) != mp.end()) {
			heaps[mp[item]].counter++;
			Heap_Down(mp[item]);
		}
		else if (heap_num < SIZE) {
			heaps[heap_num].item = item;
			heaps[heap_num].counter = counter;
			mp[item] = heap_num++;
			Heap_Up(heap_num - 1);
		}
		else if (counter > heaps[0].counter) {
			mp.erase(heaps[0].item);
			heaps[0].item = item;
			heaps[0].counter = counter;
			mp[item] = 0;
			Heap_Down(0);
		}
	}